

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# body.cc
# Opt level: O3

void __thiscall
apollonia::PolygonBody::PolygonBody(PolygonBody *this,Float mass,VertexList *vertices)

{
  float fVar1;
  float fVar2;
  pointer pVVar3;
  Mat22 *pMVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  
  (this->super_Body)._vptr_Body = (_func_int **)&PTR__Body_00149cf0;
  (this->super_Body).centroid_.x = 0.0;
  (this->super_Body).centroid_.y = 0.0;
  (this->super_Body).position_.x = 0.0;
  (this->super_Body).position_.y = 0.0;
  (this->super_Body).rotation_.mat_._M_elems[0].x = 1.0;
  (this->super_Body).rotation_.mat_._M_elems[0].y = 0.0;
  pMVar4 = &(this->super_Body).rotation_;
  (pMVar4->mat_)._M_elems[1].x = 0.0;
  (pMVar4->mat_)._M_elems[1].y = 1.0;
  (this->super_Body).velocity_.x = 0.0;
  (this->super_Body).velocity_.y = 0.0;
  (this->super_Body).angular_velocity_ = 0.0;
  (this->super_Body).force_.x = 0.0;
  *(undefined8 *)&(this->super_Body).force_.y = 0;
  (this->super_Body).friction_ = 1.0;
  (this->super_Body).bounce_ = 0.0;
  (this->super_Body).mass_ = mass;
  (this->super_Body).inv_mass_ = 1.0 / mass;
  (this->super_Body)._vptr_Body = (_func_int **)&PTR__PolygonBody_00149cd0;
  std::vector<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>::vector(&this->vertices_,vertices);
  pVVar3 = (vertices->super__Vector_base<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>)._M_impl
           .super__Vector_impl_data._M_start;
  fVar10 = 0.0;
  fVar14 = 0.0;
  fVar11 = 0.0;
  lVar5 = (long)(vertices->super__Vector_base<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)pVVar3;
  if (lVar5 != 0) {
    lVar5 = lVar5 >> 3;
    lVar6 = 1;
    do {
      fVar12 = pVVar3[lVar6 + -1].x;
      fVar13 = pVVar3[lVar6 + -1].y;
      lVar7 = 0;
      if (lVar5 != lVar6) {
        lVar7 = lVar6;
      }
      fVar1 = pVVar3[lVar7].x;
      fVar2 = pVVar3[lVar7].y;
      fVar17 = ABS(fVar12 * fVar2 - fVar1 * fVar13);
      fVar11 = fVar11 + (fVar12 * fVar1 + fVar13 * fVar2 +
                        fVar1 * fVar1 + fVar2 * fVar2 + fVar12 * fVar12 + fVar13 * fVar13) * fVar17;
      fVar14 = fVar14 + fVar17;
      lVar7 = (-(ulong)(lVar5 == 0) - lVar5) + lVar6;
      lVar6 = lVar6 + 1;
    } while (lVar7 != 0);
  }
  fVar14 = ((fVar11 * mass) / 6.0) / fVar14;
  (this->super_Body).inertia_ = fVar14;
  (this->super_Body).inv_inertia_ = 1.0 / fVar14;
  pVVar3 = (vertices->super__Vector_base<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>)._M_impl
           .super__Vector_impl_data._M_start;
  lVar5 = (long)(vertices->super__Vector_base<apollonia::Vec2,_std::allocator<apollonia::Vec2>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)pVVar3;
  auVar16 = ZEXT816(0);
  if (lVar5 != 0) {
    lVar5 = lVar5 >> 3;
    lVar7 = lVar5 + (ulong)(lVar5 == 0);
    lVar6 = 1;
    auVar15 = auVar16;
    do {
      lVar8 = lVar6;
      if (lVar5 == lVar6) {
        lVar8 = 0;
      }
      fVar10 = pVVar3[lVar6 + -1].x;
      fVar11 = pVVar3[lVar6 + -1].y;
      fVar14 = pVVar3[lVar8].x;
      fVar13 = pVVar3[lVar8].y;
      fVar12 = fVar13 * fVar10 - fVar11 * fVar14;
      auVar16._0_4_ = auVar15._0_4_ + fVar12 * (fVar10 + fVar14);
      auVar16._4_4_ = auVar15._4_4_ + fVar12 * (fVar11 + fVar13);
      auVar16._8_4_ = auVar15._8_4_ + fVar12 * 0.0;
      auVar16._12_4_ = auVar15._12_4_ + fVar12 * 0.0;
      bVar9 = lVar6 != lVar7;
      lVar6 = lVar6 + 1;
      auVar15 = auVar16;
    } while (bVar9);
    fVar10 = 0.0;
    lVar6 = 1;
    do {
      lVar8 = lVar6;
      if (lVar5 == lVar6) {
        lVar8 = 0;
      }
      fVar10 = fVar10 + (pVVar3[lVar6 + -1].x * pVVar3[lVar8].y -
                        pVVar3[lVar8].x * pVVar3[lVar6 + -1].y);
      bVar9 = lVar6 != lVar7;
      lVar6 = lVar6 + 1;
    } while (bVar9);
    fVar10 = fVar10 * 0.5;
  }
  auVar16 = divps(auVar16,_DAT_001222d0);
  auVar15._4_4_ = fVar10;
  auVar15._0_4_ = fVar10;
  auVar15._8_8_ = 0;
  auVar16 = divps(auVar16,auVar15);
  (this->super_Body).centroid_ = auVar16._0_8_;
  return;
}

Assistant:

PolygonBody::PolygonBody(Float mass, const VertexList& vertices)
    : Body(mass), vertices_(vertices) {
  set_inertia(PolygonInertia(mass, vertices));
  set_centroid(PolygonCentroid(vertices));
}